

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  code *pcVar1;
  uint16_t uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  undefined8 *in_RCX;
  byte *p;
  uint32_t *in_RDI;
  undefined8 *in_R8;
  undefined4 *in_R9;
  ptls_iovec_t pVar6;
  byte *in_stack_00000008;
  byte *in_stack_00000010;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  st_ptls_extension_bitmap_t bitmap;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint16_t exttype;
  uint8_t *in_stack_fffffffffffffeb8;
  uint8_t **in_stack_fffffffffffffec0;
  uint32_t *in_stack_fffffffffffffec8;
  uint8_t *local_110;
  size_t local_108;
  ulong local_e8;
  long local_e0;
  undefined8 in_stack_ffffffffffffff28;
  uint8_t hstype;
  st_ptls_extension_bitmap_t *in_stack_ffffffffffffff30;
  ulong local_c0;
  long local_b8;
  st_ptls_extension_bitmap_t local_b0;
  ptls_iovec_t local_a8;
  byte *local_98;
  ulong local_80;
  long local_78;
  ptls_iovec_t local_70;
  byte *local_60;
  ulong local_48;
  long local_40;
  uint local_38;
  uint16_t local_32;
  undefined4 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  uint32_t *local_8;
  
  hstype = (uint8_t)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  local_38 = ptls_decode32(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           in_stack_fffffffffffffeb8);
  if ((local_38 == 0) &&
     (local_38 = ptls_decode32(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8), local_38 == 0)) {
    local_40 = 1;
    if (in_stack_00000010 == in_stack_00000008) {
      local_38 = 0x32;
    }
    else {
      local_48 = 0;
      do {
        pbVar4 = in_stack_00000008 + 1;
        local_48 = local_48 << 8 | (ulong)*in_stack_00000008;
        local_40 = local_40 + -1;
        in_stack_00000008 = pbVar4;
      } while (local_40 != 0);
      if ((ulong)((long)in_stack_00000010 - (long)pbVar4) < local_48) {
        local_38 = 0x32;
      }
      else {
        local_60 = pbVar4 + local_48;
        local_70 = ptls_iovec_init(pbVar4,(long)local_60 - (long)pbVar4);
        *local_20 = local_70.base;
        local_20[1] = local_70.len;
        in_stack_00000008 = local_60;
        local_78 = 2;
        if ((ulong)((long)in_stack_00000010 - (long)local_60) < 2) {
          local_38 = 0x32;
        }
        else {
          local_80 = 0;
          do {
            pbVar4 = in_stack_00000008 + 1;
            local_80 = local_80 << 8 | (ulong)*in_stack_00000008;
            local_78 = local_78 + -1;
            in_stack_00000008 = pbVar4;
          } while (local_78 != 0);
          if ((ulong)((long)in_stack_00000010 - (long)pbVar4) < local_80) {
            local_38 = 0x32;
          }
          else {
            local_98 = pbVar4 + local_80;
            if (pbVar4 == local_98) {
              local_38 = 0x32;
            }
            else {
              local_a8 = ptls_iovec_init(pbVar4,(long)local_98 - (long)pbVar4);
              pbVar4 = local_98;
              *local_28 = local_a8.base;
              local_28[1] = local_a8.len;
              in_stack_00000008 = local_98;
              *local_30 = 0;
              init_extension_bitmap(in_stack_ffffffffffffff30,hstype);
              local_b8 = 2;
              if ((ulong)((long)in_stack_00000010 - (long)pbVar4) < 2) {
                local_38 = 0x32;
              }
              else {
                local_c0 = 0;
                do {
                  pbVar4 = in_stack_00000008 + 1;
                  local_c0 = local_c0 << 8 | (ulong)*in_stack_00000008;
                  local_b8 = local_b8 + -1;
                  in_stack_00000008 = pbVar4;
                } while (local_b8 != 0);
                if ((ulong)((long)in_stack_00000010 - (long)pbVar4) < local_c0) {
                  local_38 = 0x32;
                }
                else {
                  pbVar4 = pbVar4 + local_c0;
                  do {
                    if (in_stack_00000008 == pbVar4) {
                      if (in_stack_00000008 != pbVar4) {
                        return 0x32;
                      }
                      if (in_stack_00000008 != in_stack_00000010) {
                        return 0x32;
                      }
                      return 0;
                    }
                    local_38 = ptls_decode16((uint16_t *)in_stack_fffffffffffffec8,
                                             in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
                    if (local_38 != 0) {
                      return local_38;
                    }
                    iVar3 = extension_bitmap_is_set(&local_b0,local_32);
                    if (iVar3 != 0) {
                      return 0x2f;
                    }
                    extension_bitmap_set(&local_b0,local_32);
                    uVar2 = local_32;
                    local_e0 = 2;
                    if ((ulong)((long)pbVar4 - (long)in_stack_00000008) < 2) {
                      return 0x32;
                    }
                    local_e8 = 0;
                    do {
                      p = in_stack_00000008 + 1;
                      local_e8 = local_e8 << 8 | (ulong)*in_stack_00000008;
                      local_e0 = local_e0 + -1;
                      in_stack_00000008 = p;
                    } while (local_e0 != 0);
                    if ((ulong)((long)pbVar4 - (long)p) < local_e8) {
                      return 0x32;
                    }
                    pbVar5 = p + local_e8;
                    if (*(long *)(*(long *)local_8 + 0xb0) != 0) {
                      pcVar1 = (code *)**(undefined8 **)(*(long *)local_8 + 0xb0);
                      in_stack_fffffffffffffec0 = *(uint8_t ***)(*(long *)local_8 + 0xb0);
                      in_stack_fffffffffffffec8 = local_8;
                      pVar6 = ptls_iovec_init(p,(long)pbVar5 - (long)p);
                      local_110 = pVar6.base;
                      local_108 = pVar6.len;
                      iVar3 = (*pcVar1)(in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,4,uVar2,
                                        local_110,local_108);
                      local_38 = (uint)(iVar3 != 0);
                      if (iVar3 != 0) {
                        return local_38;
                      }
                    }
                    in_stack_00000008 = pbVar5;
                    if (local_32 == 0x2a) {
                      iVar3 = ptls_decode32(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                            in_stack_fffffffffffffeb8);
                      if (iVar3 != 0) {
                        return iVar3;
                      }
                      local_38 = 0;
                      in_stack_00000008 = p;
                    }
                  } while (in_stack_00000008 == pbVar5);
                  local_38 = 0x32;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_38;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}